

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Memory.h
# Opt level: O0

int __thiscall
Eigen::internal::SparseLUImpl<double,_int>::memInit
          (SparseLUImpl<double,_int> *this,int m,int n,int annz,int lwork,int fillratio,
          int panel_size,GlobalLU_t *glu)

{
  int iVar1;
  int *piVar2;
  Index IVar3;
  Index IVar4;
  bool bVar5;
  int estimated_size;
  int tempSpace;
  Index *local_38;
  int *num_expansions;
  int local_28;
  int fillratio_local;
  int lwork_local;
  int annz_local;
  int n_local;
  int m_local;
  SparseLUImpl<double,_int> *this_local;
  
  local_38 = &glu->num_expansions;
  *local_38 = 0;
  tempSpace = (fillratio * annz) / n;
  num_expansions._4_4_ = fillratio;
  local_28 = lwork;
  fillratio_local = annz;
  lwork_local = n;
  annz_local = m;
  _n_local = this;
  piVar2 = std::min<int>(&tempSpace,&annz_local);
  iVar1 = *piVar2;
  glu->nzlumax = iVar1 * lwork_local;
  glu->nzumax = iVar1 * lwork_local;
  estimated_size = 4;
  piVar2 = std::max<int>(&estimated_size,(int *)((long)&num_expansions + 4));
  glu->nzlmax = (*piVar2 * fillratio_local) / 4;
  if (local_28 == -1) {
    this_local._4_4_ =
         lwork_local * 0x15 + 0x14 +
         (panel_size * 2 + 7) * annz_local * 4 + (panel_size + 1) * annz_local * 8 +
         (glu->nzlmax + glu->nzumax) * 4 + (glu->nzlumax + glu->nzumax) * 8;
  }
  else {
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)glu,(long)(lwork_local + 1))
    ;
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&(glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,
               (long)(lwork_local + 1));
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&(glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,
               (long)(lwork_local + 1));
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&(glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,
               (long)(lwork_local + 1));
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&(glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,
               (long)(lwork_local + 1));
    do {
      iVar1 = SparseLUImpl<double,int>::expand<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SparseLUImpl<double,int> *)this,&glu->lusup,&glu->nzlumax,0,0,local_38);
      if ((((iVar1 < 0) ||
           (iVar1 = SparseLUImpl<double,int>::expand<Eigen::Matrix<double,_1,1,0,_1,1>>
                              ((SparseLUImpl<double,int> *)this,&glu->ucol,&glu->nzumax,0,0,local_38
                              ), iVar1 < 0)) ||
          (iVar1 = SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
                             ((SparseLUImpl<double,int> *)this,&glu->lsub,&glu->nzlmax,0,0,local_38)
          , iVar1 < 0)) ||
         (iVar1 = SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
                            ((SparseLUImpl<double,int> *)this,&glu->usub,&glu->nzumax,0,1,local_38),
         iVar1 < 0)) {
        glu->nzlumax = glu->nzlumax / 2;
        glu->nzumax = glu->nzumax / 2;
        glu->nzlmax = glu->nzlmax / 2;
        if (glu->nzlumax < fillratio_local) {
          return glu->nzlumax;
        }
      }
      IVar3 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&glu->lusup);
      bVar5 = true;
      if (IVar3 != 0) {
        IVar3 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&glu->ucol);
        bVar5 = true;
        if (IVar3 != 0) {
          IVar4 = EigenBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::size
                            ((EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&glu->lsub);
          bVar5 = true;
          if (IVar4 != 0) {
            IVar4 = EigenBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::size
                              ((EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&glu->usub);
            bVar5 = IVar4 == 0;
          }
        }
      }
    } while (bVar5);
    *local_38 = *local_38 + 1;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

Index SparseLUImpl<Scalar,Index>::memInit(Index m, Index n, Index annz, Index lwork, Index fillratio, Index panel_size,  GlobalLU_t& glu)
{
  Index& num_expansions = glu.num_expansions; //No memory expansions so far
  num_expansions = 0;
  glu.nzumax = glu.nzlumax = (std::min)(fillratio * annz / n, m) * n; // estimated number of nonzeros in U 
  glu.nzlmax = (std::max)(Index(4), fillratio) * annz / 4; // estimated  nnz in L factor
  // Return the estimated size to the user if necessary
  Index tempSpace;
  tempSpace = (2*panel_size + 4 + LUNoMarker) * m * sizeof(Index) + (panel_size + 1) * m * sizeof(Scalar);
  if (lwork == emptyIdxLU) 
  {
    Index estimated_size;
    estimated_size = (5 * n + 5) * sizeof(Index)  + tempSpace
                    + (glu.nzlmax + glu.nzumax) * sizeof(Index) + (glu.nzlumax+glu.nzumax) *  sizeof(Scalar) + n; 
    return estimated_size;
  }
  
  // Setup the required space 
  
  // First allocate Integer pointers for L\U factors
  glu.xsup.resize(n+1);
  glu.supno.resize(n+1);
  glu.xlsub.resize(n+1);
  glu.xlusup.resize(n+1);
  glu.xusub.resize(n+1);

  // Reserve memory for L/U factors
  do 
  {
    if(     (expand<ScalarVector>(glu.lusup, glu.nzlumax, 0, 0, num_expansions)<0)
        ||  (expand<ScalarVector>(glu.ucol,  glu.nzumax,  0, 0, num_expansions)<0)
        ||  (expand<IndexVector> (glu.lsub,  glu.nzlmax,  0, 0, num_expansions)<0)
        ||  (expand<IndexVector> (glu.usub,  glu.nzumax,  0, 1, num_expansions)<0) )
    {
      //Reduce the estimated size and retry
      glu.nzlumax /= 2;
      glu.nzumax /= 2;
      glu.nzlmax /= 2;
      if (glu.nzlumax < annz ) return glu.nzlumax; 
    }
  } while (!glu.lusup.size() || !glu.ucol.size() || !glu.lsub.size() || !glu.usub.size());
  
  ++num_expansions;
  return 0;
  
}